

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignaturePruning.cpp
# Opt level: O0

Pass * wasm::createSignaturePruningPass(void)

{
  SignaturePruning *this;
  
  this = (SignaturePruning *)operator_new(0x68);
  memset(this,0,0x68);
  anon_unknown_217::SignaturePruning::SignaturePruning(this);
  return &this->super_Pass;
}

Assistant:

Pass* createSignaturePruningPass() { return new SignaturePruning(); }